

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::StructUnionTypeSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == StructType) || (kind == UnionType)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool StructUnionTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::StructType:
        case SyntaxKind::UnionType:
            return true;
        default:
            return false;
    }
}